

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSenseDataFilterSemanticBD *value)

{
  bool bVar1;
  NextChainResult NVar2;
  XrResult XVar3;
  XrSenseDataFilterSemanticBD *pXVar4;
  ulong uVar5;
  uint32_t in_stack_fffffffffffffd1c;
  XrResult local_2c8;
  allocator local_2c1;
  string local_2c0;
  XrSenseDataFilterSemanticBD *local_2a0;
  string local_298;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_2a0 = value;
  if (value->type != XR_TYPE_SENSE_DATA_FILTER_SEMANTIC_BD) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSenseDataFilterSemanticBD",value->type,
               "VUID-XrSenseDataFilterSemanticBD-type-type",XR_TYPE_SENSE_DATA_FILTER_SEMANTIC_BD,
               "XR_TYPE_SENSE_DATA_FILTER_SEMANTIC_BD");
  }
  if (!check_pnext) goto LAB_001aba11;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,command_name,objects_info,local_2a0->next,
                            &valid_ext_structs,&encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2c0);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2c0,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::string
              ((string *)&local_2c0,"VUID-XrSenseDataFilterSemanticBD-next-unique",
               (allocator *)&stack0xfffffffffffffd1f);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_298,
               "Multiple structures of the same type(s) in \"next\" chain for XrSenseDataFilterSemanticBD struct"
               ,&local_2c1);
    CoreValidLogMessage(instance_info,&local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c0);
LAB_001ab9dc:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrSenseDataFilterSemanticBD-next-next",
               (allocator *)&local_298);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2c0,
               "Invalid structure(s) in \"next\" chain for XrSenseDataFilterSemanticBD struct \"next\""
               ,(allocator *)&stack0xfffffffffffffd1f);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001ab9dc;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001aba11:
  pXVar4 = local_2a0;
  if (check_members && XVar3 == XR_SUCCESS) {
    local_2c8 = XR_SUCCESS;
    if ((local_2a0->labelCount == 0) && (local_2a0->labels != (XrSemanticLabelBD *)0x0)) {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrSenseDataFilterSemanticBD-labelCount-arraylength",
                 (allocator *)&local_298);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2c0,
                 "Structure XrSenseDataFilterSemanticBD member labelCount is non-optional and must be greater than 0"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_210,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_210);
      std::__cxx11::string::~string((string *)&error_message);
      local_2c8 = XR_ERROR_VALIDATION_FAILURE;
    }
    if (pXVar4->labels == (XrSemanticLabelBD *)0x0) {
      if (pXVar4->labelCount == 0) {
        return local_2c8;
      }
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrSenseDataFilterSemanticBD-labels-parameter",
                 (allocator *)&local_298);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_228,objects_info);
      std::__cxx11::string::string
                ((string *)&local_2c0,
                 "XrSenseDataFilterSemanticBD contains invalid NULL for XrSemanticLabelBD \"labels\" is which not optional since \"labelCount\" is set and must be non-NULL"
                 ,(allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name
                          ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&local_228,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_228);
      std::__cxx11::string::~string((string *)&error_message);
    }
    else {
      uVar5 = 0;
      do {
        if (pXVar4->labelCount <= uVar5) {
          return local_2c8;
        }
        std::__cxx11::string::string
                  ((string *)&error_message,"XrSenseDataFilterSemanticBD",(allocator *)&local_298);
        std::__cxx11::string::string((string *)&local_2c0,"labels",(allocator *)&valid_ext_structs);
        bVar1 = ValidateXrEnum(instance_info,command_name,&error_message,&local_2c0,objects_info,
                               pXVar4->labels[uVar5]);
        std::__cxx11::string::~string((string *)&local_2c0);
        std::__cxx11::string::~string((string *)&error_message);
        uVar5 = uVar5 + 1;
        pXVar4 = local_2a0;
      } while (bVar1);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrSenseDataFilterSemanticBD contains invalid XrSemanticLabelBD \"labels\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd1c);
      std::operator<<((ostream *)&error_message,(string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::string
                ((string *)&local_2c0,"VUID-XrSenseDataFilterSemanticBD-labels-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_240,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_240,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
      ~_Vector_base(&local_240);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    }
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSenseDataFilterSemanticBD* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SENSE_DATA_FILTER_SEMANTIC_BD) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSenseDataFilterSemanticBD",
                             value->type, "VUID-XrSenseDataFilterSemanticBD-type-type", XR_TYPE_SENSE_DATA_FILTER_SEMANTIC_BD, "XR_TYPE_SENSE_DATA_FILTER_SEMANTIC_BD");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSenseDataFilterSemanticBD-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSenseDataFilterSemanticBD struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSenseDataFilterSemanticBD : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSenseDataFilterSemanticBD-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSenseDataFilterSemanticBD struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->labelCount && nullptr != value->labels) {
        CoreValidLogMessage(instance_info, "VUID-XrSenseDataFilterSemanticBD-labelCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSenseDataFilterSemanticBD member labelCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->labels && 0 != value->labelCount) {
        CoreValidLogMessage(instance_info, "VUID-XrSenseDataFilterSemanticBD-labels-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrSenseDataFilterSemanticBD contains invalid NULL for XrSemanticLabelBD \"labels\" is which not "
                            "optional since \"labelCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->labels) {
        for (uint32_t value_labels_inc = 0; value_labels_inc < value->labelCount; ++value_labels_inc) {
            // Make sure the enum type XrSemanticLabelBD value is valid
            if (!ValidateXrEnum(instance_info, command_name, "XrSenseDataFilterSemanticBD", "labels", objects_info, value->labels[value_labels_inc])) {
                std::ostringstream oss_enum;
                oss_enum << "XrSenseDataFilterSemanticBD contains invalid XrSemanticLabelBD \"labels\" enum value ";
                oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->labels[value_labels_inc]));
                CoreValidLogMessage(instance_info, "VUID-XrSenseDataFilterSemanticBD-labels-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, oss_enum.str());
                return XR_ERROR_VALIDATION_FAILURE;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}